

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O2

Array2D<double> * __thiscall
JAMA::LU<double>::solve(Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *B)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  int i_1;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int j;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if ((B->m_ == this->m) && (iVar6 = isNonsingular(this), iVar6 != 0)) {
    uVar1 = B->n_;
    uVar13 = 0;
    permute_copy(__return_storage_ptr__,this,B,&this->piv,0,uVar1 - 1);
    uVar2 = this->n;
    lVar7 = (long)(int)uVar2;
    uVar12 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar12 = uVar13;
    }
    uVar8 = 0;
    if (0 < (int)uVar2) {
      uVar8 = (ulong)uVar2;
    }
    lVar9 = 1;
    for (; lVar10 = lVar9, uVar13 != uVar8; uVar13 = uVar13 + 1) {
      for (; (int)lVar10 < (int)uVar2; lVar10 = lVar10 + 1) {
        ppdVar3 = (__return_storage_ptr__->v_).data_;
        ppdVar4 = (this->LU_).v_.data_;
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          pdVar5 = ppdVar3[lVar10];
          pdVar5[uVar11] = pdVar5[uVar11] - ppdVar3[uVar13][uVar11] * ppdVar4[lVar10][uVar13];
        }
      }
      lVar9 = lVar9 + 1;
    }
    while (0 < lVar7) {
      lVar7 = lVar7 + -1;
      ppdVar3 = (this->LU_).v_.data_;
      ppdVar4 = (__return_storage_ptr__->v_).data_;
      for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
        pdVar5 = ppdVar4[lVar7];
        pdVar5[uVar13] = pdVar5[uVar13] / ppdVar3[lVar7][lVar7];
      }
      for (lVar9 = 0; lVar9 < lVar7; lVar9 = lVar9 + 1) {
        ppdVar3 = (__return_storage_ptr__->v_).data_;
        ppdVar4 = (this->LU_).v_.data_;
        for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
          pdVar5 = ppdVar3[lVar9];
          pdVar5[uVar13] = pdVar5[uVar13] - ppdVar3[lVar7][uVar13] * ppdVar4[lVar9][lVar7];
        }
      }
    }
  }
  else {
    TNT::Array2D<double>::Array2D(__return_storage_ptr__,0,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> solve (const Array2D<Real> &B) 
   {

	  /* Dimensions: A is mxn, X is nxk, B is mxk */
      
      if (B.dim1() != m) {
	  	return Array2D<Real>(0,0);
      }
      if (!isNonsingular()) {
        return Array2D<Real>(0,0);
      }

      // Copy right hand side with pivoting
      int nx = B.dim2();


	  Array2D<Real> X = permute_copy(B, piv, 0, nx-1);

      // Solve L*Y = B(piv,:)
      for (int k = 0; k < n; k++) {
         for (int i = k+1; i < n; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      // Solve U*X = Y;
      for (int k = n-1; k >= 0; k--) {
         for (int j = 0; j < nx; j++) {
            X[k][j] /= LU_[k][k];
         }
         for (int i = 0; i < k; i++) {
            for (int j = 0; j < nx; j++) {
               X[i][j] -= X[k][j]*LU_[i][k];
            }
         }
      }
      return X;
   }